

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O2

void Cof_ManPrintFanio(Cof_Man_t *p)

{
  Cof_Obj_t *pCVar1;
  int *piVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  uint uVar7;
  uint extraout_EDX;
  uint extraout_EDX_00;
  Cof_Man_t *extraout_RDX;
  Cof_Man_t *pCVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint n;
  int iVar12;
  int iVar13;
  int iVar14;
  uint n_00;
  uint uVar15;
  uint n_01;
  double dVar16;
  double dVar17;
  int local_dc;
  char Buffer [100];
  
  n_00 = 0;
  n = 0;
  n_01 = 0;
  iVar14 = 0;
  iVar13 = 0;
  iVar12 = 0;
  uVar15 = 0;
  while (((int)uVar15 < p->nObjData && (p->pObjData != (int *)0x0))) {
    pCVar1 = (Cof_Obj_t *)(p->pObjData + uVar15);
    uVar11 = *(uint *)pCVar1;
    uVar6 = uVar11;
    if ((uVar15 != 0) && ((uVar11 & 1) == 0)) {
      uVar4 = 0;
      if (0x1ff < uVar11) {
        uVar4 = Cof_ObjMffcSize(pCVar1);
        uVar6 = *(uint *)pCVar1;
      }
      uVar7 = uVar11 >> 4 & 0xf;
      uVar11 = uVar11 >> 8;
      iVar14 = iVar14 + uVar7;
      iVar13 = iVar13 + uVar11;
      iVar12 = iVar12 + uVar4;
      if (n_00 <= uVar7) {
        n_00 = uVar7;
      }
      if (n <= uVar11) {
        n = uVar11;
      }
      if ((int)n_01 <= (int)uVar4) {
        n_01 = uVar4;
      }
    }
    uVar15 = uVar15 + (uVar6 >> 8) + (uVar6 >> 4 & 0xf) + 6;
  }
  iVar5 = Abc_Base10Log(n_00);
  iVar9 = iVar5 * 10 + 10;
  iVar5 = Abc_Base10Log(n);
  iVar5 = iVar5 * 10 + 10;
  if (iVar5 < iVar9) {
    iVar5 = iVar9;
  }
  iVar9 = Abc_Base10Log(n_01);
  iVar9 = iVar9 * 10 + 10;
  if (iVar9 <= iVar5) {
    iVar9 = iVar5;
  }
  p_00 = Vec_IntStart(iVar9);
  p_01 = Vec_IntStart(iVar9);
  p_02 = Vec_IntStart(iVar9);
  uVar15 = 0;
  local_dc = 0;
  do {
    if ((p->nObjData <= (int)uVar15) || (p->pObjData == (int *)0x0)) {
      puts("The distribution of fanins, fanouts. and MFFCs in the network:");
      puts("         Number    Nodes with fanin   Nodes with fanout   Nodes with MFFC");
      for (uVar10 = 0; (long)uVar10 < (long)iVar9; uVar10 = uVar10 + 1) {
        piVar2 = p_00->pArray;
        if (((piVar2[uVar10] != 0) || (p_01->pArray[uVar10] != 0)) || (p_02->pArray[uVar10] != 0)) {
          if (uVar10 < 10) {
            printf("%15d : ",uVar10 & 0xffffffff);
          }
          else {
            iVar5 = (int)((uVar10 & 0xffffffff) / 10) * -10;
            dVar17 = (double)(int)((uVar10 & 0xffffffff) / 10);
            dVar16 = pow(10.0,dVar17);
            dVar17 = pow(10.0,dVar17);
            sprintf(Buffer,"%d - %d",(ulong)(uint)(((int)uVar10 + iVar5) * (int)dVar16),
                    (ulong)(((int)uVar10 + iVar5 + 1) * (int)dVar17 - 1));
            printf("%15s : ",Buffer);
          }
          if (piVar2[uVar10] == 0) {
            printf("              ");
          }
          else {
            printf("%11d   ");
          }
          printf("    ");
          if (p_01->pArray[uVar10] == 0) {
            printf("              ");
          }
          else {
            printf("%12d  ");
          }
          printf("    ");
          if (p_02->pArray[uVar10] == 0) {
            printf("               ");
          }
          else {
            printf("  %12d  ");
          }
          putchar(10);
        }
      }
      Vec_IntFree(p_00);
      Vec_IntFree(p_01);
      Vec_IntFree(p_02);
      printf("Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.  MFFCs: Max = %d. Ave =  %.2f.\n"
             ,(double)iVar14 / (double)p->nNodes,(double)iVar13 / (double)p->nNodes,
             (double)iVar12 / (double)local_dc,(ulong)n_00,(ulong)n,(ulong)n_01);
      return;
    }
    pCVar1 = (Cof_Obj_t *)(p->pObjData + uVar15);
    if ((uVar15 != 0) && (uVar11 = *(uint *)pCVar1, (uVar11 & 1) == 0)) {
      uVar10 = 0;
      pCVar8 = p;
      if (0x1ff < uVar11) {
        uVar6 = Cof_ObjMffcSize(pCVar1);
        uVar10 = (ulong)uVar6;
        pCVar8 = extraout_RDX;
      }
      uVar4 = uVar11 >> 4 & 0xf;
      uVar6 = uVar11 >> 8;
      if (9 < uVar4) {
        uVar4 = 0xb;
      }
      Vec_IntAddToEntry(p_00,uVar4,(int)pCVar8);
      uVar4 = extraout_EDX;
      if (uVar11 < 0xa00) {
LAB_005b8027:
        Vec_IntAddToEntry(p_01,uVar6,uVar4);
        uVar6 = extraout_EDX_00;
      }
      else {
        if (uVar11 < 0x6400) {
          uVar6 = (uint)(byte)((char)(((ushort)(uVar11 >> 8) & 0xff) / 10) + 10);
          goto LAB_005b8027;
        }
        if (uVar11 < 0x3e800) {
          uVar4 = (uVar6 & 0xffff) % 100;
          uVar3 = (short)((uVar6 & 0xffff) / 100) + 0x14;
LAB_005b8024:
          uVar6 = (uint)uVar3;
          goto LAB_005b8027;
        }
        if (uVar11 < 0x271000) {
          uVar4 = (uVar6 & 0xffff) % 1000;
          uVar3 = (short)((uVar6 & 0xffff) / 1000) + 0x1e;
          goto LAB_005b8024;
        }
        if (uVar11 < 25600000) {
          uVar4 = uVar11 % 0x271000;
          uVar6 = uVar11 / 0x271000 + 0x28;
          goto LAB_005b8027;
        }
        if (uVar11 < 256000000) {
          uVar4 = uVar11 % 25600000;
          uVar6 = uVar11 / 25600000 + 0x32;
          goto LAB_005b8027;
        }
        uVar6 = extraout_EDX;
        if (uVar11 < 2560000000) {
          uVar4 = uVar11 % 256000000;
          uVar6 = uVar11 / 256000000 + 0x3c;
          goto LAB_005b8027;
        }
      }
      uVar11 = (uint)uVar10;
      if (uVar11 != 0) {
        local_dc = local_dc + 1;
        if (9 < (int)uVar11) {
          uVar3 = (ushort)uVar10;
          if (uVar11 < 100) {
            uVar10 = (ulong)(byte)((char)((uVar3 & 0xff) / 10) + 10);
          }
          else {
            if (uVar11 < 1000) {
              uVar6 = (uint)uVar3 % 100;
              uVar3 = uVar3 / 100 + 0x14;
            }
            else {
              if (9999 < uVar11) {
                if (uVar11 < 100000) {
                  uVar6 = (uint)(uVar10 % 10000);
                  uVar10 = (ulong)((int)(uVar10 / 10000) + 0x28);
                }
                else if (uVar11 < 1000000) {
                  uVar6 = (uint)(uVar10 % 100000);
                  uVar10 = (ulong)((int)(uVar10 / 100000) + 0x32);
                }
                else {
                  if (9999999 < uVar11) goto LAB_005b809c;
                  uVar6 = (uint)(uVar10 % 1000000);
                  uVar10 = (ulong)((int)(uVar10 / 1000000) + 0x3c);
                }
                goto LAB_005b808b;
              }
              uVar6 = (uint)uVar3 % 1000;
              uVar3 = uVar3 / 1000 + 0x1e;
            }
            uVar10 = (ulong)uVar3;
          }
        }
LAB_005b808b:
        Vec_IntAddToEntry(p_02,(int)uVar10,uVar6);
      }
    }
LAB_005b809c:
    uVar15 = uVar15 + (*(uint *)pCVar1 >> 8) + (*(uint *)pCVar1 >> 4 & 0xf) + 6;
  } while( true );
}

Assistant:

void Cof_ManPrintFanio( Cof_Man_t * p )
{
    char Buffer[100];
    Cof_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts, * vMffcs;
    int nFanins, nFanouts, nMffcs, nFaninsMax, nFanoutsMax, nMffcsMax, nFaninsAll, nFanoutsAll, nMffcsAll;
    int i, k, nSizeMax, nMffcNodes = 0;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = nMffcsMax = 0;
    nFaninsAll = nFanoutsAll = nMffcsAll = 0;
    Cof_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue;
        nFanins  = Cof_ObjFaninNum(pNode);
        nFanouts = Cof_ObjFanoutNum(pNode);
        nMffcs   = pNode->nFanouts > 1 ? Cof_ObjMffcSize(pNode) : 0;
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nMffcsAll   += nMffcs;
        nFaninsMax   = Abc_MaxInt( nFaninsMax,  nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
        nMffcsMax    = Abc_MaxInt( nMffcsMax,   nMffcs );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nMffcsMax) + 1),  nSizeMax );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );
    vMffcs   = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Cof_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue;
        nFanins  = Cof_ObjFaninNum(pNode);
        nFanouts = Cof_ObjFanoutNum(pNode);
        nMffcs   = pNode->nFanouts > 1 ? Cof_ObjMffcSize(pNode) : 0;

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
       
        if ( nMffcs == 0 )
            continue;
        nMffcNodes++;

        if ( nMffcs < 10 )
            Vec_IntAddToEntry( vMffcs, nMffcs, 1 );
        else if ( nMffcs < 100 )
            Vec_IntAddToEntry( vMffcs, 10 + nMffcs/10, 1 );
        else if ( nMffcs < 1000 )
            Vec_IntAddToEntry( vMffcs, 20 + nMffcs/100, 1 );
        else if ( nMffcs < 10000 )
            Vec_IntAddToEntry( vMffcs, 30 + nMffcs/1000, 1 );
        else if ( nMffcs < 100000 )
            Vec_IntAddToEntry( vMffcs, 40 + nMffcs/10000, 1 );
        else if ( nMffcs < 1000000 )
            Vec_IntAddToEntry( vMffcs, 50 + nMffcs/100000, 1 );
        else if ( nMffcs < 10000000 )
            Vec_IntAddToEntry( vMffcs, 60 + nMffcs/1000000, 1 );
    }

    printf( "The distribution of fanins, fanouts. and MFFCs in the network:\n" );
    printf( "         Number    Nodes with fanin   Nodes with fanout   Nodes with MFFC\n" );

    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 && vMffcs->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            printf( "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 ); 
            printf( "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%11d   ", vFanins->pArray[k] );
        printf( "    " );
        if ( vFanouts->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanouts->pArray[k] );
        printf( "    " );
        if ( vMffcs->pArray[k] == 0 )
            printf( "               " );
        else
            printf( "  %12d  ", vMffcs->pArray[k] );
        printf( "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );
    Vec_IntFree( vMffcs );

    printf( "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.  MFFCs: Max = %d. Ave =  %.2f.\n", 
        nFaninsMax,  1.0*nFaninsAll /Cof_ManNodeNum(p), 
        nFanoutsMax, 1.0*nFanoutsAll/Cof_ManNodeNum(p), 
        nMffcsMax,   1.0*nMffcsAll  /nMffcNodes  );
}